

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep-lstm.cc
# Opt level: O2

void __thiscall cnn::DeepLSTMBuilder::new_graph_impl(DeepLSTMBuilder *this,ComputationGraph *cg)

{
  ulong uVar1;
  initializer_list<cnn::expr::Expression> __l;
  allocator_type local_1b1;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  *local_1b0;
  Expression i_bc;
  Expression i_h2c;
  Expression i_x2c;
  Expression i_bo;
  Expression i_c2o;
  Expression i_h2o;
  Expression i_x2o;
  Expression i_bi;
  Expression i_c2i;
  Expression i_h2i;
  Expression i_x2i;
  Expression local_f8;
  ComputationGraph *local_e8;
  uint local_e0;
  ComputationGraph *local_d8;
  uint local_d0;
  ComputationGraph *local_c8;
  uint local_c0;
  ComputationGraph *local_b8;
  uint local_b0;
  ComputationGraph *local_a8;
  uint local_a0;
  ComputationGraph *local_98;
  uint local_90;
  ComputationGraph *local_88;
  uint local_80;
  ComputationGraph *local_78;
  uint local_70;
  ComputationGraph *local_68;
  uint local_60;
  ComputationGraph *local_58;
  uint local_50;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> vars;
  
  local_1b0 = &this->param_vars;
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear(local_1b0);
  for (uVar1 = 0; uVar1 < this->layers; uVar1 = uVar1 + 1) {
    cnn::expr::parameter((ComputationGraph *)&i_x2i,(Parameters *)cg);
    cnn::expr::parameter((ComputationGraph *)&i_h2i,(Parameters *)cg);
    cnn::expr::parameter((ComputationGraph *)&i_c2i,(Parameters *)cg);
    cnn::expr::parameter((ComputationGraph *)&i_bi,(Parameters *)cg);
    cnn::expr::parameter((ComputationGraph *)&i_x2o,(Parameters *)cg);
    cnn::expr::parameter((ComputationGraph *)&i_h2o,(Parameters *)cg);
    cnn::expr::parameter((ComputationGraph *)&i_c2o,(Parameters *)cg);
    cnn::expr::parameter((ComputationGraph *)&i_bo,(Parameters *)cg);
    cnn::expr::parameter((ComputationGraph *)&i_x2c,(Parameters *)cg);
    cnn::expr::parameter((ComputationGraph *)&i_h2c,(Parameters *)cg);
    cnn::expr::parameter((ComputationGraph *)&i_bc,(Parameters *)cg);
    local_f8.pg = i_x2i.pg;
    local_f8.i.t = i_x2i.i.t;
    local_e8 = i_h2i.pg;
    local_e0 = i_h2i.i.t;
    local_d8 = i_c2i.pg;
    local_d0 = i_c2i.i.t;
    local_c8 = i_bi.pg;
    local_c0 = i_bi.i.t;
    local_b8 = i_x2o.pg;
    local_b0 = i_x2o.i.t;
    local_a8 = i_h2o.pg;
    local_a0 = i_h2o.i.t;
    local_98 = i_c2o.pg;
    local_90 = i_c2o.i.t;
    local_88 = i_bo.pg;
    local_80 = i_bo.i.t;
    local_78 = i_x2c.pg;
    local_70 = i_x2c.i.t;
    local_68 = i_h2c.pg;
    local_60 = i_h2c.i.t;
    local_58 = i_bc.pg;
    local_50 = i_bc.i.t;
    __l._M_len = 0xb;
    __l._M_array = &local_f8;
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               &vars.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,
               __l,&local_1b1);
    std::
    vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ::push_back(local_1b0,
                (value_type *)
                &vars.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>);
    std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
              (&vars.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>);
  }
  return;
}

Assistant:

void DeepLSTMBuilder::new_graph_impl(ComputationGraph& cg){
  param_vars.clear();

  for (unsigned i = 0; i < layers; ++i){
    auto& p = params[i];

    //i
    Expression i_x2i = parameter(cg,p[X2I]);
    Expression i_h2i = parameter(cg,p[H2I]);
    Expression i_c2i = parameter(cg,p[C2I]);
    Expression i_bi = parameter(cg,p[BI]);
    //o
    Expression i_x2o = parameter(cg,p[X2O]);
    Expression i_h2o = parameter(cg,p[H2O]);
    Expression i_c2o = parameter(cg,p[C2O]);
    Expression i_bo = parameter(cg,p[BO]);
    //c
    Expression i_x2c = parameter(cg,p[X2C]);
    Expression i_h2c = parameter(cg,p[H2C]);
    Expression i_bc = parameter(cg,p[BC]);

    vector<Expression> vars = {i_x2i, i_h2i, i_c2i, i_bi, i_x2o, i_h2o, i_c2o, i_bo, i_x2c, i_h2c, i_bc};
    param_vars.push_back(vars);
  }
}